

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O0

sds duckdb_hll::sdscatvprintf(sds s,char *fmt,__va_list_tag *ap)

{
  size_t sVar1;
  char *__s;
  sds pcVar2;
  undefined8 *in_RDX;
  char *in_RSI;
  size_t buflen;
  char *t;
  char *buf;
  char staticbuf [1024];
  va_list cpy;
  size_t local_450;
  char *in_stack_fffffffffffffbb8;
  char local_438 [1024];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  
  __s = local_438;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar1 = strlen(in_RSI);
  local_450 = sVar1 << 1;
  if (local_450 < 0x401) {
    local_450 = 0x400;
  }
  else {
    __s = (char *)malloc(local_450);
    if (__s == (char *)0x0) {
      return (sds)0x0;
    }
  }
  do {
    __s[local_450 - 2] = '\0';
    local_28 = local_20[2];
    local_38 = *local_20;
    uStack_30 = local_20[1];
    vsnprintf(__s,local_450,local_18,&local_38);
    if (__s[local_450 - 2] == '\0') {
      pcVar2 = sdscat(__s,in_stack_fffffffffffffbb8);
      if (__s == local_438) {
        return pcVar2;
      }
      free(__s);
      return pcVar2;
    }
    if (__s != local_438) {
      free(__s);
    }
    local_450 = local_450 << 1;
    __s = (char *)malloc(local_450);
  } while (__s != (char *)0x0);
  return (sds)0x0;
}

Assistant:

sds sdscatvprintf(sds s, const char *fmt, va_list ap) {
    va_list cpy;
    char staticbuf[1024], *buf = staticbuf, *t;
    size_t buflen = strlen(fmt)*2;

    /* We try to start using a static buffer for speed.
     * If not possible we revert to heap allocation. */
    if (buflen > sizeof(staticbuf)) {
        buf = (char*) malloc(buflen);
        if (buf == NULL) return NULL;
    } else {
        buflen = sizeof(staticbuf);
    }

    /* Try with buffers two times bigger every time we fail to
     * fit the string in the current buffer size. */
    while(1) {
        buf[buflen-2] = '\0';
        va_copy(cpy,ap);
        vsnprintf(buf, buflen, fmt, cpy);
        va_end(cpy);
        if (buf[buflen-2] != '\0') {
            if (buf != staticbuf) free(buf);
            buflen *= 2;
            buf = (char*) malloc(buflen);
            if (buf == NULL) return NULL;
            continue;
        }
        break;
    }

    /* Finally concat the obtained string to the SDS string and return it. */
    t = sdscat(s, buf);
    if (buf != staticbuf) free(buf);
    return t;
}